

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

ON_SubDComponentRef *
ON_SubDComponentRef::Create
          (ON_SubDComponentRef *__return_storage_ptr__,ON_SubDRef *subd_ref,
          ON_SubDComponentPtr component_ptr,ON_SubDComponentLocation component_location,
          ON__UINT_PTR reference_id)

{
  Type TVar1;
  ulong uVar2;
  ON_SubDFace *face;
  ON_SubDEdge *edge;
  ON_SubDVertex *vertex;
  bool local_71;
  undefined1 local_70 [7];
  bool bValidInput;
  ON_SubDComponentRef component_ref;
  ON__UINT_PTR reference_id_local;
  ON_SubDComponentLocation component_location_local;
  ON_SubDRef *subd_ref_local;
  ON_SubDComponentPtr component_ptr_local;
  
  component_ref.m_reference_id = reference_id;
  subd_ref_local = (ON_SubDRef *)component_ptr.m_ptr;
  component_ptr_local.m_ptr = (ON__UINT_PTR)__return_storage_ptr__;
  ON_SubDComponentRef((ON_SubDComponentRef *)local_70);
  ON_SubDRef::operator=
            ((ON_SubDRef *)&component_ref.super_ON_Geometry.super_ON_Object.m_userdata_list,subd_ref
            );
  component_ref._48_8_ = component_ref.m_reference_id;
  local_71 = false;
  TVar1 = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&subd_ref_local);
  if (TVar1 == Vertex) {
    uVar2 = (ulong)subd_ref_local & 0xfffffffffffffff8;
    if (((uVar2 != 0) && (*(int *)(uVar2 + 8) != 0)) && (*(int *)(uVar2 + 8) != -1)) {
      component_ref.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subd_ref_local;
      ON_COMPONENT_INDEX::Set
                ((ON_COMPONENT_INDEX *)&component_ref.m_component_ptr,subd_vertex,
                 *(int *)(uVar2 + 8));
      local_71 = true;
      component_ref.m_component_index.m_type._0_1_ = component_location;
    }
  }
  else if (TVar1 == Edge) {
    uVar2 = (ulong)subd_ref_local & 0xfffffffffffffff8;
    if (((uVar2 != 0) && (*(int *)(uVar2 + 8) != 0)) && (*(int *)(uVar2 + 8) != -1)) {
      component_ref.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subd_ref_local;
      ON_COMPONENT_INDEX::Set
                ((ON_COMPONENT_INDEX *)&component_ref.m_component_ptr,subd_edge,*(int *)(uVar2 + 8))
      ;
      local_71 = true;
      component_ref.m_component_index.m_type._0_1_ = component_location;
    }
  }
  else if (TVar1 == Face) {
    uVar2 = (ulong)subd_ref_local & 0xfffffffffffffff8;
    if (((uVar2 != 0) && (*(int *)(uVar2 + 8) != 0)) && (*(int *)(uVar2 + 8) != -1)) {
      component_ref.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subd_ref_local;
      ON_COMPONENT_INDEX::Set
                ((ON_COMPONENT_INDEX *)&component_ref.m_component_ptr,subd_face,*(int *)(uVar2 + 8))
      ;
      local_71 = true;
      component_ref.m_component_index.m_type._0_1_ = component_location;
    }
  }
  else {
    local_71 = ON_SubDComponentPtr::IsNull((ON_SubDComponentPtr *)&subd_ref_local);
  }
  if (local_71 == false) {
    ON_SubDIncrementErrorCount();
    ON_SubDComponentRef(__return_storage_ptr__,(ON_SubDComponentRef *)local_70);
  }
  else {
    ON_SubDComponentRef(__return_storage_ptr__,(ON_SubDComponentRef *)local_70);
  }
  ~ON_SubDComponentRef((ON_SubDComponentRef *)local_70);
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentRef ON_SubDComponentRef::Create(
  const ON_SubDRef& subd_ref,
  ON_SubDComponentPtr component_ptr,
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
  )
{
  ON_SubDComponentRef component_ref;
  component_ref.m_subd_ref = subd_ref;
  component_ref.m_reference_id = reference_id;
  bool bValidInput = false;
  switch (component_ptr.ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = ON_SUBD_VERTEX_POINTER(component_ptr.m_ptr);
      if (nullptr != vertex && vertex->m_id > 0 && vertex->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_vertex,(int)vertex->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(component_ptr.m_ptr);
      if (nullptr != edge && edge->m_id > 0 && edge->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_edge,(int)edge->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(component_ptr.m_ptr);
      if (nullptr != face && face->m_id > 0 && face->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_face,(int)face->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  default:
    if ( component_ptr.IsNull() )
      bValidInput = true;
  }

  if (bValidInput)
  {
    return component_ref;
  }

  return ON_SUBD_RETURN_ERROR(component_ref);
}